

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O2

void __thiscall
webfront::fs::File::File
          (File *this,span<const_unsigned_long,_18446744073709551615UL> input,size_t fileSize,
          string_view contentEncoding)

{
  allocator<char> local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = contentEncoding._M_str;
  local_20._M_len = contentEncoding._M_len;
  this->fileType = staticData;
  (this->data)._M_ptr = input._M_ptr;
  (this->data)._M_extent._M_extent_value = input._M_extent._M_extent_value._M_extent_value;
  this->readIndex = 0;
  this->size = fileSize;
  this->eofBit = fileSize == 0;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->encoding,&local_20,&local_21);
  std::ifstream::ifstream(&this->fstream);
  return;
}

Assistant:

File(std::span<const uint64_t> input, size_t fileSize, std::string_view contentEncoding = "")
        : fileType{FileType::staticData}, data(input), size(fileSize), eofBit(fileSize==0), encoding(contentEncoding) {}